

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O1

void unsigned_char_copy(void *dest,int data)

{
  *(char *)dest = (char)data;
  return;
}

Assistant:

static CopyFuncType get_copy_func(int i) {
  switch (i) {
    case 1:
      return unsigned_char_copy;
    case 2:
      return unsigned_short_copy;
    case 4:
      return unsigned_int_copy;
    default:
      d_fail("bad case");
      return 0;
  }
}